

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O2

void __thiscall TTD::UtilSupport::TTAutoString::Append(TTAutoString *this,uint64 val)

{
  HeapAllocator *this_00;
  char16_t *pcVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pcVar1 = this->m_optFormatBuff;
  if (pcVar1 == (char16_t *)0x0) {
    local_40 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x40;
    data.count = (size_t)anon_var_dwarf_435bbc2;
    data.filename._0_4_ = 200;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
    pcVar1 = (char16_t *)Memory::HeapAllocator::NoThrowAllocZero(this_00,0x80);
    pcVar1 = TTD_MEM_ALLOC_CHECK<char16_t>(pcVar1);
    this->m_optFormatBuff = pcVar1;
  }
  swprintf_s((char16_t_conflict *)pcVar1,0x20,(char16_t_conflict *)L"%I64u",val);
  Append(this,this->m_optFormatBuff,0,0xffffffffffffffff);
  return;
}

Assistant:

void TTAutoString::Append(uint64 val)
        {
            if(this->m_optFormatBuff == nullptr)
            {
                this->m_optFormatBuff = TT_HEAP_ALLOC_ARRAY_ZERO(char16, 64);
            }

            swprintf_s(this->m_optFormatBuff, 32, _u("%I64u"), val); //64 char16s is 32 words

            this->Append(this->m_optFormatBuff);
        }